

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O1

void utest_gui_component_parse_slider_3(int *utest_result,size_t utest_index)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  pointer pGVar6;
  char *pcVar7;
  long lVar8;
  string error;
  string line;
  string uniform_line;
  GUIComponent component;
  undefined1 local_158 [24];
  long lStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  GUIComponent local_c8;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60 [2];
  long local_50 [2];
  char *local_40 [2];
  
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_130._M_allocated_capacity = (size_type)&local_120;
  local_130._8_8_ = 0;
  local_120._M_local_buf[0] = '\0';
  local_c8.UniformName._M_string_length = 0;
  local_c8.UniformName.field_2._M_allocated_capacity = 0;
  local_c8.UniformName.field_2._8_8_ = 0;
  local_c8._40_8_ = 0;
  local_c8._48_8_ = 0;
  local_c8.Data[1] = 0.0;
  local_c8.Data[2] = 0.0;
  local_c8.Data[3] = 0.0;
  local_c8._68_4_ = 0;
  local_c8.Type = EGUIComponentTypeSlider1;
  local_c8.UniformType = EGUIUniformTypeFloat;
  local_c8.UniformName._M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)0x0,0x15f790);
  std::__cxx11::string::_M_replace((ulong)&local_e8,0,(char *)local_e8._M_string_length,0x15f7a1);
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = (pointer)0x0;
  local_158._16_8_ = (pointer)0x0;
  bVar2 = GUIComponentParse(0,&local_108,&local_e8,
                            (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                            &local_c8,(string *)&local_130);
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
            ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
  if (!bVar2) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xcf);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xcf);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      local_158._0_8_ = (pointer)0x0;
      local_158._8_8_ = (pointer)0x0;
      local_158._16_8_ = (pointer)0x0;
      bVar2 = GUIComponentParse(0,&local_108,&local_e8,
                                (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                                &local_c8,(string *)&local_130);
      pcVar7 = "false";
      if (bVar2) {
        pcVar7 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar7);
      std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
                ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
    }
    local_158._0_8_ = (pointer)0x0;
    local_158._8_8_ = (pointer)0x0;
    local_158._16_8_ = (pointer)0x0;
    GUIComponentParse(0,&local_108,&local_e8,
                      (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,&local_c8,
                      (string *)&local_130);
    printf("    Actual : %s\n");
    std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
              ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
    *utest_result = 1;
  }
  if ((local_c8.field_4.SliderRange.Start != -1.0) || (NAN(local_c8.field_4.SliderRange.Start))) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xd0);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xd0);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    if (utest_state.output != (FILE *)0x0) {
      pcVar7 = "true";
      if (local_c8.field_4.SliderRange.Start != -1.0) {
        pcVar7 = "false";
      }
      if (NAN(local_c8.field_4.SliderRange.Start)) {
        pcVar7 = "false";
      }
      fprintf((FILE *)utest_state.output,"    Actual : %s\n",pcVar7);
    }
    printf("    Actual : %s\n");
    *utest_result = 1;
  }
  if ((local_c8.field_4.SliderRange.End != 2.5) || (NAN(local_c8.field_4.SliderRange.End))) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xd1);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xd1);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    if (utest_state.output != (FILE *)0x0) {
      pcVar7 = "true";
      if (local_c8.field_4.SliderRange.End != 2.5) {
        pcVar7 = "false";
      }
      if (NAN(local_c8.field_4.SliderRange.End)) {
        pcVar7 = "false";
      }
      fprintf((FILE *)utest_state.output,"    Actual : %s\n",pcVar7);
    }
    printf("    Actual : %s\n");
    *utest_result = 1;
  }
  if (local_c8.UniformType != EGUIUniformTypeVec3) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xd2);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xd2);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    if (utest_state.output != (FILE *)0x0) {
      pcVar7 = "false";
      if (local_c8.UniformType == EGUIUniformTypeVec3) {
        pcVar7 = "true";
      }
      fprintf((FILE *)utest_state.output,"    Actual : %s\n",pcVar7);
    }
    printf("    Actual : %s\n");
    *utest_result = 1;
  }
  if (local_130._8_8_ != 0) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xd3);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xd3);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    if (utest_state.output != (FILE *)0x0) {
      pcVar7 = "false";
      if (local_130._8_8_ == 0) {
        pcVar7 = "true";
      }
      fprintf((FILE *)utest_state.output,"    Actual : %s\n",pcVar7);
    }
    printf("    Actual : %s\n");
    *utest_result = 1;
  }
  std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)local_108._M_string_length,0x15f7b2);
  std::__cxx11::string::_M_replace((ulong)&local_e8,0,(char *)local_e8._M_string_length,0x15f7a1);
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = (pointer)0x0;
  local_158._16_8_ = (pointer)0x0;
  bVar2 = GUIComponentParse(0,&local_108,&local_e8,
                            (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                            &local_c8,(string *)&local_130);
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
            ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
  if (bVar2) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xd7);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xd7);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      local_158._0_8_ = (pointer)0x0;
      local_158._8_8_ = (pointer)0x0;
      local_158._16_8_ = (pointer)0x0;
      bVar2 = GUIComponentParse(0,&local_108,&local_e8,
                                (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                                &local_c8,(string *)&local_130);
      pcVar7 = "true";
      if (bVar2) {
        pcVar7 = "false";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar7);
      std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
                ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
    }
    local_158._0_8_ = (pointer)0x0;
    local_158._8_8_ = (pointer)0x0;
    local_158._16_8_ = (pointer)0x0;
    bVar2 = GUIComponentParse(0,&local_108,&local_e8,
                              (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                              &local_c8,(string *)&local_130);
    pcVar7 = "true";
    if (bVar2) {
      pcVar7 = "false";
    }
    printf("    Actual : %s\n",pcVar7);
    std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
              ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
    *utest_result = 1;
  }
  iVar3 = strcmp((char *)local_130._M_allocated_capacity,
                 "Invalid format for GUI component data \'()\'\nFormat should be @slider3(start_range, end_range) at line 0"
                );
  if (iVar3 != 0) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xd8);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xd8);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      iVar3 = strcmp((char *)local_130._M_allocated_capacity,
                     "Invalid format for GUI component data \'()\'\nFormat should be @slider3(start_range, end_range) at line 0"
                    );
      pcVar7 = "false";
      if (iVar3 == 0) {
        pcVar7 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar7);
    }
    strcmp((char *)local_130._M_allocated_capacity,
           "Invalid format for GUI component data \'()\'\nFormat should be @slider3(start_range, end_range) at line 0"
          );
    printf("    Actual : %s\n");
    *utest_result = 1;
  }
  std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)local_108._M_string_length,0x15f823);
  std::__cxx11::string::_M_replace((ulong)&local_e8,0,(char *)local_e8._M_string_length,0x15f7a1);
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = (pointer)0x0;
  local_158._16_8_ = (pointer)0x0;
  bVar2 = GUIComponentParse(2,&local_108,&local_e8,
                            (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                            &local_c8,(string *)&local_130);
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
            ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
  if (bVar2) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xdc);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xdc);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      local_158._0_8_ = (pointer)0x0;
      local_158._8_8_ = (pointer)0x0;
      local_158._16_8_ = (pointer)0x0;
      bVar2 = GUIComponentParse(2,&local_108,&local_e8,
                                (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                                &local_c8,(string *)&local_130);
      pcVar7 = "true";
      if (bVar2) {
        pcVar7 = "false";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar7);
      std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
                ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
    }
    local_158._0_8_ = (pointer)0x0;
    local_158._8_8_ = (pointer)0x0;
    local_158._16_8_ = (pointer)0x0;
    bVar2 = GUIComponentParse(2,&local_108,&local_e8,
                              (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                              &local_c8,(string *)&local_130);
    pcVar7 = "true";
    if (bVar2) {
      pcVar7 = "false";
    }
    printf("    Actual : %s\n",pcVar7);
    std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
              ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
    *utest_result = 1;
  }
  iVar3 = strcmp((char *)local_130._M_allocated_capacity,
                 "Invalid format for GUI component data \'(5.0)\'\nFormat should be @slider3(start_range, end_range) at line 2"
                );
  if (iVar3 != 0) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xdd);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xdd);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      iVar3 = strcmp((char *)local_130._M_allocated_capacity,
                     "Invalid format for GUI component data \'(5.0)\'\nFormat should be @slider3(start_range, end_range) at line 2"
                    );
      pcVar7 = "false";
      if (iVar3 == 0) {
        pcVar7 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar7);
    }
    strcmp((char *)local_130._M_allocated_capacity,
           "Invalid format for GUI component data \'(5.0)\'\nFormat should be @slider3(start_range, end_range) at line 2"
          );
    printf("    Actual : %s\n");
    *utest_result = 1;
  }
  std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)local_108._M_string_length,0x15f790);
  local_40[0] = "float";
  local_40[1] = "vec2";
  lVar8 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,*(char **)((long)local_40 + lVar8),&local_109);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x15f5f8);
    local_80 = &local_70;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_70 = *plVar5;
      lStack_68 = plVar4[3];
    }
    else {
      local_70 = *plVar5;
      local_80 = (long *)*plVar4;
    }
    local_78 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
    pGVar6 = (pointer)(plVar4 + 2);
    if ((pointer)*plVar4 == pGVar6) {
      local_158._16_8_ = *(undefined8 *)pGVar6;
      lStack_140 = plVar4[3];
      local_158._0_8_ = (pointer)(local_158 + 0x10);
    }
    else {
      local_158._16_8_ = *(undefined8 *)pGVar6;
      local_158._0_8_ = (pointer)*plVar4;
    }
    local_158._8_8_ = plVar4[1];
    *plVar4 = (long)pGVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_e8,(string *)local_158);
    if ((pointer)local_158._0_8_ != (pointer)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,
                      (ulong)((long)(EGUIComponentType *)local_158._16_8_ + 1));
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
    local_158._0_8_ = (pointer)0x0;
    local_158._8_8_ = (pointer)0x0;
    local_158._16_8_ = (pointer)0x0;
    bVar2 = GUIComponentParse(5,&local_108,&local_e8,
                              (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                              &local_c8,(string *)&local_130);
    std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
              ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
    if (bVar2) {
      if (utest_state.output != (FILE *)0x0) {
        fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
                "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
                ,0xe2);
      }
      printf("%s:%u: Failure\n",
             "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
             ,0xe2);
      if (utest_state.output != (FILE *)0x0) {
        fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
      }
      puts("  Expected : true");
      pFVar1 = utest_state.output;
      if (utest_state.output != (FILE *)0x0) {
        local_158._0_8_ = (pointer)0x0;
        local_158._8_8_ = (pointer)0x0;
        local_158._16_8_ = (pointer)0x0;
        bVar2 = GUIComponentParse(5,&local_108,&local_e8,
                                  (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                                  &local_c8,(string *)&local_130);
        pcVar7 = "false";
        if (!bVar2) {
          pcVar7 = "true";
        }
        fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar7);
        std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
                  ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
      }
      local_158._0_8_ = (pointer)0x0;
      local_158._8_8_ = (pointer)0x0;
      local_158._16_8_ = (pointer)0x0;
      bVar2 = GUIComponentParse(5,&local_108,&local_e8,
                                (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                                &local_c8,(string *)&local_130);
      pcVar7 = "false";
      if (!bVar2) {
        pcVar7 = "true";
      }
      printf("    Actual : %s\n",pcVar7);
      std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
                ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
      *utest_result = 1;
    }
    iVar3 = strcmp((char *)local_130._M_allocated_capacity,
                   "GUI component count does not match uniform component count at line 5");
    if (iVar3 != 0) {
      if (utest_state.output != (FILE *)0x0) {
        fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
                "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
                ,0xe3);
      }
      printf("%s:%u: Failure\n",
             "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
             ,0xe3);
      if (utest_state.output != (FILE *)0x0) {
        fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
      }
      puts("  Expected : true");
      pFVar1 = utest_state.output;
      if (utest_state.output != (FILE *)0x0) {
        iVar3 = strcmp((char *)local_130._M_allocated_capacity,
                       "GUI component count does not match uniform component count at line 5");
        pcVar7 = "true";
        if (iVar3 != 0) {
          pcVar7 = "false";
        }
        fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar7);
      }
      iVar3 = strcmp((char *)local_130._M_allocated_capacity,
                     "GUI component count does not match uniform component count at line 5");
      pcVar7 = "true";
      if (iVar3 != 0) {
        pcVar7 = "false";
      }
      printf("    Actual : %s\n",pcVar7);
      *utest_result = 1;
    }
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.UniformName._M_dataplus._M_p != &local_c8.UniformName.field_2) {
    operator_delete(local_c8.UniformName._M_dataplus._M_p,
                    local_c8.UniformName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_allocated_capacity != &local_120) {
    operator_delete((void *)local_130._M_allocated_capacity,
                    CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

UTEST(gui, component_parse_slider_3) {
    std::string line, uniform_line, error;
    GUIComponent component;

    line = "slider3(-1, 2.5)";
    uniform_line = "uniform vec3 v0;";
    T(GUIComponentParse(0, line, uniform_line, {}, component, error));
    T(component.SliderRange.Start == -1);
    T(component.SliderRange.End == 2.5);
    T(component.UniformType == EGUIUniformTypeVec3);
    T(error.empty());

    line = "slider3()";
    uniform_line = "uniform vec3 v0;";
    T(!GUIComponentParse(0, line, uniform_line, {}, component, error));
    TSTR(error.c_str(), "Invalid format for GUI component data '()'\nFormat should be @slider3(start_range, end_range) at line 0");

    line = "slider3(5.0)";
    uniform_line = "uniform vec3 v0;";
    T(!GUIComponentParse(2, line, uniform_line, {}, component, error));
    TSTR(error.c_str(), "Invalid format for GUI component data '(5.0)'\nFormat should be @slider3(start_range, end_range) at line 2");

    line = "slider3(-1, 2.5)";
    for (const auto& datatype : {"float", "vec2"}) {
        uniform_line = "uniform " + std::string(datatype) + " v0;";
        T(!GUIComponentParse(5, line, uniform_line, {}, component, error));
        TSTR(error.c_str(), "GUI component count does not match uniform component count at line 5");
    }
}